

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int Gia_WinTryAddingNode(Gia_Man_t *p,int iPivot,int iPivot2,Vec_Wec_t *vLevels,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  Gia_Obj_t *pGVar20;
  
  if (0 < (long)vLevels->nSize) {
    lVar13 = 0;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + *(int *)((long)&vLevels->pArray->nSize + lVar13);
      lVar13 = lVar13 + 0x10;
    } while ((long)vLevels->nSize * 0x10 != lVar13);
    if (iVar15 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x23e,
                    "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
    }
  }
  if (iPivot < p->nTravIdsAlloc) {
    if (p->pTravIds[iPivot] == p->nTravIds) {
      __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x240,
                    "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
    }
    p->pTravIds[iPivot] = p->nTravIds;
    uVar8 = Gia_ObjLevelId(p,iPivot);
    if (vLevels->nSize <= (int)uVar8) {
      iVar15 = uVar8 + 1;
      iVar14 = vLevels->nSize * 2;
      if (iVar14 <= iVar15) {
        iVar14 = iVar15;
      }
      if (vLevels->nCap < iVar14) {
        sVar16 = (long)iVar14 << 4;
        if (vLevels->pArray == (Vec_Int_t *)0x0) {
          pVVar10 = (Vec_Int_t *)malloc(sVar16);
        }
        else {
          pVVar10 = (Vec_Int_t *)realloc(vLevels->pArray,sVar16);
        }
        vLevels->pArray = pVVar10;
        memset(pVVar10 + vLevels->nCap,0,((long)iVar14 - (long)vLevels->nCap) * 0x10);
        vLevels->nCap = iVar14;
      }
      vLevels->nSize = iVar15;
    }
    if (((int)uVar8 < 0) || (vLevels->nSize <= (int)uVar8)) {
LAB_007a468e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    Vec_IntPush(vLevels->pArray + uVar8,iPivot);
    if (iPivot2 != -1) {
      if (p->nTravIdsAlloc <= iPivot2) goto LAB_007a46cc;
      if (p->pTravIds[iPivot2] == p->nTravIds) {
        __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x248,
                      "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
      }
      p->pTravIds[iPivot2] = p->nTravIds;
      uVar8 = Gia_ObjLevelId(p,iPivot2);
      if (vLevels->nSize <= (int)uVar8) {
        iVar14 = uVar8 + 1;
        iVar15 = vLevels->nSize * 2;
        if (iVar15 <= iVar14) {
          iVar15 = iVar14;
        }
        if (vLevels->nCap < iVar15) {
          sVar16 = (long)iVar15 << 4;
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar10 = (Vec_Int_t *)malloc(sVar16);
          }
          else {
            pVVar10 = (Vec_Int_t *)realloc(vLevels->pArray,sVar16);
          }
          vLevels->pArray = pVVar10;
          memset(pVVar10 + vLevels->nCap,0,((long)iVar15 - (long)vLevels->nCap) * 0x10);
          vLevels->nCap = iVar15;
        }
        vLevels->nSize = iVar14;
      }
      if (((int)uVar8 < 0) || (vLevels->nSize <= (int)uVar8)) goto LAB_007a468e;
      Vec_IntPush(vLevels->pArray + uVar8,iPivot2);
    }
    if (vLevels->nSize < 1) {
      iVar15 = 0;
    }
    else {
      lVar13 = 0;
      iVar15 = 0;
      do {
        pVVar10 = vLevels->pArray;
        if (0 < pVVar10[lVar13].nSize) {
          lVar18 = 0;
LAB_007a4227:
          iVar14 = pVVar10[lVar13].pArray[lVar18];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_007a4650;
          if (p->pObjs != (Gia_Obj_t *)0x0) {
            pGVar1 = p->pObjs + iVar14;
            pGVar11 = p->pObjs;
            if (pGVar11 <= pGVar1) {
              iVar14 = 0;
              do {
                iVar4 = p->nObjs;
                pGVar2 = pGVar11 + iVar4;
                if (pGVar2 <= pGVar1) break;
                uVar8 = (int)((long)pGVar1 - (long)pGVar11 >> 2) * -0x55555555;
                if (((int)uVar8 < 0) || (p->vFanoutNums->nSize <= (int)uVar8)) {
LAB_007a4612:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                if (p->vFanoutNums->pArray[uVar8 & 0x7fffffff] <= iVar14) goto LAB_007a450b;
                iVar9 = p->vFanout->nSize;
                if (iVar9 <= (int)uVar8) goto LAB_007a4612;
                piVar6 = p->vFanout->pArray;
                uVar8 = piVar6[uVar8 & 0x7fffffff] + iVar14;
                if (((int)uVar8 < 0) || (iVar9 <= (int)uVar8)) goto LAB_007a4612;
                iVar9 = piVar6[uVar8];
                lVar17 = (long)iVar9;
                if ((lVar17 < 0) || (iVar4 <= iVar9)) goto LAB_007a4650;
                iVar14 = iVar14 + 1;
                if (iVar14 == 6) goto LAB_007a450b;
                pGVar3 = pGVar11 + lVar17;
                uVar7 = *(ulong *)pGVar3;
                if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
                  if (iVar4 <= iVar9) break;
                  iVar4 = p->nTravIdsAlloc;
                  if (iVar4 <= iVar9) {
LAB_007a466f:
                    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
                  }
                  piVar6 = p->pTravIds;
                  iVar5 = p->nTravIds;
                  if (piVar6[lVar17] != iVar5) {
                    pGVar20 = pGVar3 + -(uVar7 & 0x1fffffff);
                    if ((pGVar20 < pGVar11) || (pGVar2 <= pGVar20)) break;
                    iVar19 = (int)((long)pGVar20 - (long)pGVar11 >> 2) * -0x55555555;
                    if (iVar4 <= iVar19) goto LAB_007a466f;
                    if (piVar6[iVar19] == iVar5) {
                      pGVar20 = pGVar3 + -(ulong)((uint)(uVar7 >> 0x20) & 0x1fffffff);
                      if ((pGVar20 < pGVar11) || (pGVar2 <= pGVar20)) break;
                      iVar19 = (int)((long)pGVar20 - (long)pGVar11 >> 2) * -0x55555555;
                      if (iVar4 <= iVar19) goto LAB_007a466f;
                      if (piVar6[iVar19] == iVar5) {
                        piVar6[lVar17] = iVar5;
                        if (p->nObjs <= iVar9) break;
                        uVar8 = Gia_ObjLevelId(p,iVar9);
                        pGVar11 = p->pObjs;
                        if ((pGVar3 < pGVar11) || (pGVar11 + p->nObjs <= pGVar3)) break;
                        if (vLevels->nSize <= (int)uVar8) {
                          iVar4 = uVar8 + 1;
                          iVar9 = vLevels->nSize * 2;
                          if (iVar9 <= iVar4) {
                            iVar9 = iVar4;
                          }
                          if (vLevels->nCap < iVar9) {
                            sVar16 = (long)iVar9 << 4;
                            if (vLevels->pArray == (Vec_Int_t *)0x0) {
                              pVVar12 = (Vec_Int_t *)malloc(sVar16);
                            }
                            else {
                              pVVar12 = (Vec_Int_t *)realloc(vLevels->pArray,sVar16);
                            }
                            vLevels->pArray = pVVar12;
                            memset(pVVar12 + vLevels->nCap,0,
                                   ((long)iVar9 - (long)vLevels->nCap) * 0x10);
                            vLevels->nCap = iVar9;
                          }
                          vLevels->nSize = iVar4;
                        }
                        if (((int)uVar8 < 0) || (vLevels->nSize <= (int)uVar8)) goto LAB_007a468e;
                        Vec_IntPush(vLevels->pArray + uVar8,
                                    (int)((ulong)((long)pGVar3 - (long)pGVar11) >> 2) * -0x55555555)
                        ;
                        iVar15 = iVar15 + 1;
                      }
                    }
                  }
                }
                pGVar11 = p->pObjs;
                if (pGVar1 < pGVar11) break;
              } while( true );
            }
            goto LAB_007a4631;
          }
        }
LAB_007a452f:
        lVar13 = lVar13 + 1;
      } while (lVar13 < vLevels->nSize);
    }
    if (0 < vLevels->nSize) {
      lVar13 = 0;
      do {
        pVVar10 = vLevels->pArray;
        if (0 < pVVar10[lVar13].nSize) {
          lVar18 = 0;
          do {
            iVar14 = pVVar10[lVar13].pArray[lVar18];
            if (((long)iVar14 < 0) || (iVar4 = p->nObjs, iVar4 <= iVar14)) {
LAB_007a4650:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if (vNodes == (Vec_Int_t *)0x0) {
              if (iVar4 <= iVar14) {
LAB_007a4631:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              if (p->nTravIdsAlloc <= iVar14) {
                __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x263,"void Gia_ObjSetTravIdPrevious(Gia_Man_t *, Gia_Obj_t *)");
              }
              p->pTravIds[iVar14] = p->nTravIds + -1;
            }
            else {
              if (iVar4 <= iVar14) goto LAB_007a4631;
              Vec_IntPush(vNodes,iVar14);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < pVVar10[lVar13].nSize);
        }
        pVVar10[lVar13].nSize = 0;
        lVar13 = lVar13 + 1;
      } while (lVar13 < vLevels->nSize);
    }
    return iVar15;
  }
LAB_007a46cc:
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
LAB_007a450b:
  lVar18 = lVar18 + 1;
  if (pVVar10[lVar13].nSize <= lVar18) goto LAB_007a452f;
  goto LAB_007a4227;
}

Assistant:

int Gia_WinTryAddingNode( Gia_Man_t * p, int iPivot, int iPivot2, Vec_Wec_t * vLevels, Vec_Int_t * vNodes )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, Count = 0;
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition:  the new object to be added (iPivot) is not in the window
    assert( !Gia_ObjIsTravIdCurrentId(p, iPivot) );
    // add the object to the window and to the levelized structure
    Gia_ObjSetTravIdCurrentId( p, iPivot );
    Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot), iPivot );
    // the same about the second node if it is given
    if ( iPivot2 != -1 )
    {
        // precondition:  the new object to be added (iPivot2) is not in the window
        assert( !Gia_ObjIsTravIdCurrentId(p, iPivot2) );
        // add the object to the window and to the levelized structure
        Gia_ObjSetTravIdCurrentId( p, iPivot2 );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot2), iPivot2 );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    // count the number of nodes in the structure
                    Count++;
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
    {
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            if ( vNodes == NULL ) // it was a test run - unmark the node
                Gia_ObjSetTravIdPrevious( p, pObj );
            else // it was a real run - permanently add to the node to the window
                Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        // clean the levelized structure
        Vec_IntClear( vLevel );
    }
    // return the number of nodes to be added
    return Count;
}